

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O3

string * __thiscall
cmGlobalGenerator::FrameworkDescriptor::GetLinkName_abi_cxx11_
          (string *__return_storage_ptr__,FrameworkDescriptor *this)

{
  pointer pcVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  undefined1 local_58 [32];
  basic_string_view<char,_std::char_traits<char>_> local_38;
  undefined8 local_28;
  undefined1 *local_20;
  size_type local_18;
  pointer local_10;
  
  local_18 = (this->Suffix)._M_string_length;
  if (local_18 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->Name)._M_string_length);
  }
  else {
    local_38._M_str = (this->Name)._M_dataplus._M_p;
    local_38._M_len = (this->Name)._M_string_length;
    local_20 = local_58;
    local_58[0] = 0x2c;
    local_28 = 1;
    local_10 = (this->Suffix)._M_dataplus._M_p;
    views._M_len = 3;
    views._M_array = &local_38;
    cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetLinkName() const
    {
      return this->Suffix.empty() ? this->Name
                                  : cmStrCat(this->Name, ',', this->Suffix);
    }